

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apple_sysf.cpp
# Opt level: O1

void __thiscall apple_sysf_t::sysf_store_body_t::_read(sysf_store_body_t *this)

{
  pointer *ppuVar1;
  pointer pcVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  iterator __position;
  bool bVar3;
  bool bVar4;
  uint8_t uVar5;
  int iVar6;
  pointer __p;
  sysf_variable_t *this_01;
  pointer __p_00;
  pointer *__ptr;
  bool bVar7;
  _Head_base<0UL,_apple_sysf_t::sysf_variable_t_*,_false> local_78;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  __p = (pointer)operator_new(0x18);
  (__p->
  super__Vector_base<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->
  super__Vector_base<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->
  super__Vector_base<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
           *)&this->m_variables,__p);
  do {
    this_01 = (sysf_variable_t *)operator_new(0x80);
    sysf_variable_t::sysf_variable_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
    local_78._M_head_impl = this_01;
    std::
    vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>
    ::
    emplace_back<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>
              ((vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>
                *)(this->m_variables)._M_t.
                  super___uniq_ptr_impl<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_*,_false>
                  ._M_head_impl,
               (unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
                *)&local_78);
    if (local_78._M_head_impl != (sysf_variable_t *)0x0) {
      (*((local_78._M_head_impl)->super_kstruct)._vptr_kstruct[1])();
    }
    bVar7 = this_01->m_len_name == 3;
    if (bVar7) {
      local_50 = local_40;
      pcVar2 = (this_01->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + (this_01->m_name)._M_string_length);
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"EOF","");
      if (local_48 != local_68) goto LAB_0015d577;
      bVar3 = true;
      if (local_48 == 0) {
        bVar4 = true;
      }
      else {
        iVar6 = bcmp(local_50,local_70,local_48);
        bVar4 = true;
        if (iVar6 != 0) goto LAB_0015d577;
      }
    }
    else {
LAB_0015d577:
      bVar4 = kaitai::kstream::is_eof((this->super_kstruct).m__io);
      bVar3 = bVar7;
    }
    if (bVar3) {
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
    }
    if (bVar4 != false) {
      __p_00 = (pointer)operator_new(0x18);
      (__p_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__p_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      __uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::reset((__uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)&this->m_zeroes,__p_00);
      bVar7 = kaitai::kstream::is_eof((this->super_kstruct).m__io);
      while (!bVar7) {
        this_00 = (this->m_zeroes)._M_t.
                  super___uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>
                  ._M_head_impl;
        uVar5 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
        local_78._M_head_impl._0_1_ = uVar5;
        __position._M_current =
             (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>(this_00,__position,(uchar *)&local_78);
        }
        else {
          *__position._M_current = uVar5;
          ppuVar1 = &(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        bVar7 = kaitai::kstream::is_eof((this->super_kstruct).m__io);
      }
      return;
    }
  } while( true );
}

Assistant:

void apple_sysf_t::sysf_store_body_t::_read() {
    m_variables = std::unique_ptr<std::vector<std::unique_ptr<sysf_variable_t>>>(new std::vector<std::unique_ptr<sysf_variable_t>>());
    {
        int i = 0;
        sysf_variable_t* _;
        do {
            _ = new sysf_variable_t(m__io, this, m__root);
            m_variables->push_back(std::move(std::unique_ptr<sysf_variable_t>(_)));
            i++;
        } while (!( (( ((_->len_name() == 3) && (_->name() == (std::string("EOF")))) ) || (_io()->is_eof())) ));
    }
    m_zeroes = std::unique_ptr<std::vector<uint8_t>>(new std::vector<uint8_t>());
    {
        int i = 0;
        while (!m__io->is_eof()) {
            m_zeroes->push_back(std::move(m__io->read_u1()));
            i++;
        }
    }
}